

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O2

void __thiscall KeySequentialExecutor::start(KeySequentialExecutor *this)

{
  thread *this_00;
  _Bind<void_(KeySequentialExecutor::*(KeySequentialExecutor_*))()> local_28;
  
  this_00 = (thread *)operator_new(8);
  local_28._M_f = (offset_in_KeySequentialExecutor_to_subr)run;
  local_28._8_8_ = 0;
  local_28._M_bound_args.super__Tuple_impl<0UL,_KeySequentialExecutor_*>.
  super__Head_base<0UL,_KeySequentialExecutor_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_KeySequentialExecutor_*>)(_Tuple_impl<0UL,_KeySequentialExecutor_*>)this;
  std::thread::thread<std::_Bind<void(KeySequentialExecutor::*(KeySequentialExecutor*))()>,,void>
            (this_00,&local_28);
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&this->m_thread,
             this_00);
  return;
}

Assistant:

void KeySequentialExecutor::start()
{
    //std::cout << "KeySequentialExecutor " << m_name << " starting ..." << std::endl;
    m_thread.reset(new std::thread(std::bind(&KeySequentialExecutor::run, this)));
}